

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O1

void __thiscall r_exec::Goal::~Goal(Goal *this)

{
  _Object *p_Var1;
  
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Goal_001beec8;
  p_Var1 = (this->ground).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  p_Var1 = (this->sim).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  Object<r_code::LObject,_r_exec::LObject>::~Object
            ((Object<r_code::LObject,_r_exec::LObject> *)this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT Goal:
    public LObject
{
public:
    Goal();
    Goal(r_code::SysObject *source);
    Goal(_Fact *target, Code *actor, double psln_thr);

    bool invalidate();
    bool is_invalidated();
    bool ground_invalidated(_Fact *evidence);

    bool is_requirement() const;

    bool is_self_goal() const;
    bool is_drive() const;

    _Fact *get_target() const;
    _Fact *get_super_goal() const;
    Code *get_actor() const;

    P<Sim> sim;
    P<_Fact> ground; // f->p->f->imdl (weak requirement) that allowed backward chaining, if any.

    double get_strength(uint64_t now) const; // goal->target->cfd/(before-now).
}